

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

void __thiscall Darts::Details::DoubleArrayBuilder::expand_units(DoubleArrayBuilder *this)

{
  ulong uVar1;
  DoubleArrayBuilderExtraUnit *pDVar2;
  id_type iVar3;
  DoubleArrayBuilderExtraUnit *pDVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar1 = (this->units_).size_;
  iVar3 = (id_type)uVar1;
  uVar6 = iVar3 + 0x100;
  uVar8 = (int)(uVar1 >> 8) - 0x10;
  if (uVar8 < 0xffffffef) {
    fix_block(this,uVar8);
  }
  AutoPool<Darts::Details::DoubleArrayBuilderUnit>::resize(&this->units_,(ulong)uVar6);
  if (uVar8 < 0xffffffef) {
    pDVar2 = (this->extras_).array_;
    for (uVar5 = uVar1 & 0xffffffff; uVar5 < uVar6; uVar5 = uVar5 + 1) {
      pDVar4 = pDVar2 + ((uint)uVar5 & 0xfff);
      pDVar4->is_fixed_ = false;
      pDVar4->is_used_ = false;
    }
  }
  pDVar2 = (this->extras_).array_;
  uVar5 = uVar1 & 0xffffffff;
  while (uVar8 = (uint)uVar5, uVar7 = uVar8 + 1, uVar7 < uVar6) {
    pDVar2[uVar8 & 0xfff].next_ = uVar7;
    pDVar2[uVar7 & 0xfff].prev_ = uVar8;
    uVar5 = (ulong)uVar7;
  }
  uVar7 = iVar3 + 0xff;
  pDVar2[uVar1 & 0xfff].prev_ = uVar7;
  uVar6 = this->extras_head_;
  uVar5 = (ulong)uVar6 & 0xfff;
  uVar8 = pDVar2[uVar5].prev_;
  pDVar2[uVar1 & 0xfff].prev_ = uVar8;
  pDVar2[uVar7 & 0xfff].next_ = uVar6;
  pDVar2[(ulong)uVar8 & 0xfff].next_ = iVar3;
  pDVar2[uVar5].prev_ = uVar7;
  return;
}

Assistant:

inline void DoubleArrayBuilder::expand_units() {
  id_type src_num_units = units_.size();
  id_type src_num_blocks = num_blocks();

  id_type dest_num_units = src_num_units + BLOCK_SIZE;
  id_type dest_num_blocks = src_num_blocks + 1;

  if (dest_num_blocks > NUM_EXTRA_BLOCKS) {
    fix_block(src_num_blocks - NUM_EXTRA_BLOCKS);
  }

  units_.resize(dest_num_units);

  if (dest_num_blocks > NUM_EXTRA_BLOCKS) {
    for (std::size_t id = src_num_units; id < dest_num_units; ++id) {
      extras(id).set_is_used(false);
      extras(id).set_is_fixed(false);
    }
  }

  for (id_type i = src_num_units + 1; i < dest_num_units; ++i) {
    extras(i - 1).set_next(i);
    extras(i).set_prev(i - 1);
  }

  extras(src_num_units).set_prev(dest_num_units - 1);
  extras(dest_num_units - 1).set_next(src_num_units);

  extras(src_num_units).set_prev(extras(extras_head_).prev());
  extras(dest_num_units - 1).set_next(extras_head_);

  extras(extras(extras_head_).prev()).set_next(src_num_units);
  extras(extras_head_).set_prev(dest_num_units - 1);
}